

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall
QList<QXmlStreamNamespaceDeclaration>::resize
          (QList<QXmlStreamNamespaceDeclaration> *this,qsizetype size)

{
  Data *pDVar1;
  QXmlStreamNamespaceDeclaration *pQVar2;
  long lVar3;
  
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     (pQVar2 = (this->d).ptr,
     ((long)((long)pQVar2 -
            ((ulong)((long)&pDVar1[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
     0x5555555555555555 + (pDVar1->super_QArrayData).alloc < size)) {
    QArrayDataPointer<QXmlStreamNamespaceDeclaration>::detachAndGrow
              (&this->d,GrowsAtEnd,size - (this->d).size,(QXmlStreamNamespaceDeclaration **)0x0,
               (QArrayDataPointer<QXmlStreamNamespaceDeclaration> *)0x0);
    lVar3 = (this->d).size;
  }
  else {
    lVar3 = (this->d).size;
    if (size < lVar3) {
      std::_Destroy_aux<false>::__destroy<QXmlStreamNamespaceDeclaration*>
                (pQVar2 + size,pQVar2 + lVar3);
      goto LAB_0039c024;
    }
  }
  if (size <= lVar3) {
    return;
  }
  pQVar2 = (this->d).ptr;
  std::__uninitialized_default_1<false>::__uninit_default<QXmlStreamNamespaceDeclaration*>
            (pQVar2 + lVar3,pQVar2 + size);
LAB_0039c024:
  (this->d).size = size;
  return;
}

Assistant:

void resize(qsizetype size)
    {
        resize_internal(size);
        if (size > this->size())
            d->appendInitialize(size);
    }